

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Ch *__src;
  ssize_t sVar1;
  Stack<rapidjson::CrtAllocator> *__n_00;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  ulong __n_01;
  Stack<rapidjson::CrtAllocator> local_88;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_58;
  
  local_58.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_88;
  __n_00 = &local_88;
  local_88.stack_ = (char *)0x0;
  local_88.stackTop_ = (char *)0x0;
  local_88.allocator_ = (CrtAllocator *)0x0;
  local_88.ownAllocator_ = (CrtAllocator *)0x0;
  local_88.stackEnd_ = (char *)0x0;
  local_88.initialCapacity_ = 0x200;
  local_58.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_58.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_58.level_stack_.stackEnd_ = (char *)0x0;
  local_58.level_stack_.stack_ = (char *)0x0;
  local_58.level_stack_.stackTop_ = (char *)0x0;
  local_58.level_stack_.initialCapacity_ = 0x200;
  local_58.maxDecimalPlaces_ = 0x144;
  local_58.hasRoot_ = false;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)CONCAT44(in_register_00000034,__fd),&local_58);
  __n_01 = (long)local_88.stackTop_ - (long)local_88.stack_;
  if (__n_01 < 0x7ff) {
    __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_88);
    memcpy(this->m_sendBuf,__src,__n_01);
    *(undefined2 *)((long)this + __n_01 + 0x280) = 10;
    sVar1 = send(this,(int)__n_01 + 1,__buf_00,(size_t)__n_00,__flags);
  }
  else {
    __fd_00 = 0x192534;
    Log::print(ERR,"[%s] send failed: \"send buffer overflow: %zu > %zu\"",
               (this->super_BaseClient).m_pool.m_url.m_url.m_data,__n_01,0x7fe);
    close(this,__fd_00);
    sVar1 = -1;
  }
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_58.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_88);
  return sVar1;
}

Assistant:

int64_t xmrig::Client::send(const rapidjson::Value &obj)
{
    using namespace rapidjson;

    Value value;

    StringBuffer buffer(nullptr, 512);
    Writer<StringBuffer> writer(buffer);
    obj.Accept(writer);

    const size_t size = buffer.GetSize();
    if (size > (sizeof(m_sendBuf) - 2)) {
        LOG_ERR("[%s] send failed: \"send buffer overflow: %zu > %zu\"", url(), size, (sizeof(m_sendBuf) - 2));
        close();
        return -1;
    }

    memcpy(m_sendBuf, buffer.GetString(), size);
    m_sendBuf[size]     = '\n';
    m_sendBuf[size + 1] = '\0';

    return send(size + 1);
}